

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall
VRasterizer::rasterize
          (VRasterizer *this,VPath *path,CapStyle cap,JoinStyle join,float width,float miterLimit,
          VRect *clip)

{
  SharedRle *this_00;
  undefined8 uVar1;
  VRle VVar2;
  Data *this_01;
  undefined7 in_register_00000009;
  pointer __n;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int __fd;
  type tmp;
  VRle local_40;
  vcow_ptr<VPath::VPathData> local_38;
  VPath *__stat_loc;
  
  __n = (pointer)CONCAT71(in_register_00000009,join);
  __stat_loc = path;
  init(this,(EVP_PKEY_CTX *)path);
  __fd = (int)__stat_loc;
  this_00 = (SharedRle *)
            (this->d).super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (1e-06 < ABS(width)) {
    local_40.d.mModel = (vcow_ptr<VRle::Data>)(path->d).mModel;
    __n = (((VPathData *)&((model *)local_40.d.mModel)->mValue)->m_elements).
          super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
          super__Vector_impl_data._M_finish;
    if ((((VPathData *)&((model *)local_40.d.mModel)->mValue)->m_elements).
        super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
        super__Vector_impl_data._M_start != __n) {
      (path->d).mModel = (model *)0x0;
      SharedRle::wait(this_00,__stat_loc);
      VVar2.d.mModel = local_40.d.mModel;
      this_00->_ready = false;
      this_00->_pending = true;
      local_40.d.mModel = (vcow_ptr<VRle::Data>)(model *)0x0;
      local_38.mModel = (model *)this_00[1]._rle.d.mModel;
      this_00[1]._rle.d.mModel = (model *)VVar2.d.mModel;
      vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_38);
      this_00[1]._mutex.super___mutex_base._M_mutex.__size[0x19] = cap;
      this_00[1]._mutex.super___mutex_base._M_mutex.__size[0x1a] = join;
      this_00[1]._mutex.super___mutex_base._M_mutex.__data.__lock = (int)width;
      this_00[1]._mutex.super___mutex_base._M_mutex.__data.__count = (uint)miterLimit;
      uVar1 = *(undefined8 *)&clip->x2;
      *(undefined8 *)((long)&this_00[1]._mutex.super___mutex_base._M_mutex + 8) =
           *(undefined8 *)clip;
      *(undefined8 *)((long)&this_00[1]._mutex.super___mutex_base._M_mutex + 0x10) = uVar1;
      this_00[1]._mutex.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
      vcow_ptr<VPath::VPathData>::~vcow_ptr((vcow_ptr<VPath::VPathData> *)&local_40);
      updateRequest(this);
      return;
    }
  }
  SharedRle::wait(this_00,__stat_loc);
  this_01 = (Data *)vcow_ptr<VRle::Data>::write
                              ((vcow_ptr<VRle::Data> *)this_00,__fd,
                               (void *)CONCAT44(extraout_var,extraout_EDX),(size_t)__n);
  VRle::Data::reset(this_01);
  return;
}

Assistant:

void VRasterizer::rasterize(VPath path, CapStyle cap, JoinStyle join,
                            float width, float miterLimit, const VRect &clip)
{
    init();
    if (path.empty() || vIsZero(width)) {
        d->rle().reset();
        return;
    }
    d->task().update(std::move(path), cap, join, width, miterLimit, clip);
    updateRequest();
}